

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetGXMarkerInfo(ndicapi *pol,int port,int marker)

{
  unsigned_long uVar1;
  char (*local_28) [12];
  char *dp;
  int marker_local;
  int port_local;
  ndicapi *pol_local;
  
  if ((marker < 0x41) || (0x54 < marker)) {
    pol_local._4_4_ = 0;
  }
  else {
    if ((port < 0x31) || (0x33 < port)) {
      if ((port < 0x41) || (0x49 < port)) {
        return 0;
      }
      local_28 = pol->GxPassiveInformation + (port + -0x41);
    }
    else {
      local_28 = pol->GxInformation + (port + -0x31);
    }
    uVar1 = ndiHexToUnsignedLong(*local_28 + (0xb - (marker + -0x41)),1);
    pol_local._4_4_ = (int)uVar1;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetGXMarkerInfo(ndicapi* pol, int port, int marker)
{
  char* dp;

  if (marker < 'A' || marker > 'T')
  {
    return 0;
  }

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxInformation[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveInformation[port - 'A'];
  }
  else
  {
    return 0;
  }
  dp += 11 - (marker - 'A');

  return (int)ndiHexToUnsignedLong(dp, 1);
}